

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1acccd7::Scenario::CheckExpired(Scenario *this,NodeId peer,GenTxid gtxid)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *this_00;
  Runner *pRVar2;
  pointer pcVar3;
  pointer __a;
  pointer ppVar4;
  pointer ppVar5;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar6;
  long lVar7;
  pointer ppVar8;
  anon_class_88_4_a7d767dc *__args_1;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000000L>_> local_90;
  NodeId local_88;
  GenTxid local_80;
  anon_class_88_4_a7d767dc *local_58 [2];
  Runner *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->m_runner;
  local_80.m_is_wtxid = gtxid.m_is_wtxid;
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[1] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[1];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[2] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[2];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[3] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[3];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[4] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[4];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[5] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[5];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[6] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[6];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[7] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[7];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[8] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[8];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[9] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[9];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[10] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[10];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  __args_1 = (anon_class_88_4_a7d767dc *)&stack0xffffffffffffffb8;
  pcVar3 = (this->m_testname)._M_dataplus._M_p;
  local_90.__r = (rep)pRVar2;
  local_88 = peer;
  local_58[0] = __args_1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + (this->m_testname)._M_string_length);
  __a = (pRVar2->actions).
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (__a == (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = &pRVar2->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(this_00,1,"vector::_M_realloc_insert");
    ppVar4 = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__n == 0) {
      ppVar6 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)0x0;
    }
    else {
      ppVar6 = __gnu_cxx::
               new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
               ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)this_00,__n,(void *)0x0);
    }
    lVar7 = (long)__a - (long)ppVar4 >> 3;
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
              ((allocator_type *)(&ppVar6->first + lVar7),
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)&this->m_now,&local_90,(anon_class_88_4_a7d767dc *)(lVar7 * -0x3333333333333333));
    ppVar8 = _GLOBAL__N_1::std::
             vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ::_S_do_relocate(ppVar4,__a,ppVar6,this_00);
    ppVar8 = _GLOBAL__N_1::std::
             vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ::_S_do_relocate(__a,ppVar5,ppVar8 + 1,this_00);
    if (ppVar4 != (pointer)0x0) {
      operator_delete(ppVar4,(long)(pRVar2->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4
                     );
    }
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar6;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar8;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar6 + __n;
  }
  else {
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
              ((allocator_type *)__a,
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)&this->m_now,&local_90,__args_1);
    pppVar1 = &(pRVar2->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (local_58[0] != (anon_class_88_4_a7d767dc *)&stack0xffffffffffffffb8) {
    operator_delete(local_58[0],
                    (ulong)((long)&(local_48->txrequest).m_impl._M_t.
                                   super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                                   .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false> + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckExpired(NodeId peer, GenTxid gtxid)
    {
        const auto& testname = m_testname;
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            auto it = runner.expired.find(std::pair<NodeId, GenTxid>{peer, gtxid});
            BOOST_CHECK_MESSAGE(it != runner.expired.end(), "[" + testname + "] missing expiration");
            if (it != runner.expired.end()) runner.expired.erase(it);
        });
    }